

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

mg_path * mg_path_copy_ca(mg_path *path,mg_allocator *allocator)

{
  uint uVar1;
  uint uVar2;
  mg_path *buf;
  mg_node *pmVar3;
  mg_unbound_relationship *pmVar4;
  ulong uVar5;
  
  uVar1 = path->node_count;
  uVar2 = path->relationship_count;
  buf = (mg_path *)
        mg_allocator_malloc(&mg_system_allocator,
                            (ulong)uVar2 * 8 + (ulong)uVar1 * 8 + (ulong)path->sequence_length * 8 +
                            0x28);
  if (buf == (mg_path *)0x0) {
    return (mg_path *)0x0;
  }
  buf->nodes = (mg_node **)(buf + 1);
  buf->relationships = (mg_unbound_relationship **)(&buf[1].node_count + (ulong)uVar1 * 2);
  buf->sequence = (int64_t *)(&buf[1].node_count + (ulong)uVar1 * 2 + (ulong)uVar2 * 2);
  buf->node_count = 0;
  if (path->node_count != 0) {
    uVar5 = 0;
    do {
      pmVar3 = mg_node_copy_ca(path->nodes[uVar5],allocator);
      buf->nodes[uVar5] = pmVar3;
      if (buf->nodes[uVar5] == (mg_node *)0x0) goto LAB_00109bfd;
      buf->node_count = buf->node_count + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < path->node_count);
  }
  buf->relationship_count = 0;
  if (path->relationship_count != 0) {
    uVar5 = 0;
    do {
      pmVar4 = mg_unbound_relationship_copy_ca(path->relationships[uVar5],allocator);
      buf->relationships[uVar5] = pmVar4;
      if (buf->relationships[uVar5] == (mg_unbound_relationship *)0x0) {
LAB_00109bfd:
        if (buf->node_count != 0) {
          uVar5 = 0;
          do {
            mg_node_destroy_ca(buf->nodes[uVar5],&mg_system_allocator);
            uVar5 = uVar5 + 1;
          } while (uVar5 < buf->node_count);
        }
        if (buf->relationship_count != 0) {
          uVar5 = 0;
          do {
            mg_unbound_relationship_destroy_ca(buf->relationships[uVar5],&mg_system_allocator);
            uVar5 = uVar5 + 1;
          } while (uVar5 < buf->relationship_count);
        }
        mg_allocator_free(&mg_system_allocator,buf);
        return (mg_path *)0x0;
      }
      buf->relationship_count = buf->relationship_count + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < path->relationship_count);
  }
  uVar1 = path->sequence_length;
  buf->sequence_length = uVar1;
  memcpy(buf->sequence,path->sequence,(ulong)uVar1 << 3);
  return buf;
}

Assistant:

mg_path *mg_path_copy_ca(const mg_path *path, mg_allocator *allocator) {
  mg_path *npath = mg_path_alloc(path->node_count, path->relationship_count,
                                 path->sequence_length, &mg_system_allocator);
  if (!npath) {
    return NULL;
  }
  npath->node_count = 0;
  for (uint32_t i = 0; i < path->node_count; ++i) {
    npath->nodes[i] = mg_node_copy_ca(path->nodes[i], allocator);
    if (!npath->nodes[i]) {
      goto cleanup;
    }
    npath->node_count++;
  }
  npath->relationship_count = 0;
  for (uint32_t i = 0; i < path->relationship_count; ++i) {
    npath->relationships[i] =
        mg_unbound_relationship_copy_ca(path->relationships[i], allocator);
    if (!npath->relationships[i]) {
      goto cleanup;
    }
    npath->relationship_count++;
  }
  npath->sequence_length = path->sequence_length;
  memcpy(npath->sequence, path->sequence,
         path->sequence_length * sizeof(int64_t));
  return npath;

cleanup:
  for (uint32_t i = 0; i < npath->node_count; ++i) {
    mg_node_destroy(npath->nodes[i]);
  }
  for (uint32_t i = 0; i < npath->relationship_count; ++i) {
    mg_unbound_relationship_destroy(npath->relationships[i]);
  }
  mg_allocator_free(&mg_system_allocator, npath);
  return NULL;
}